

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::switchToFullscreen(WindowImplX11 *this)

{
  Display *pDVar1;
  bool bVar2;
  int iVar3;
  Atom AVar4;
  Atom AVar5;
  ostream *poVar6;
  char *pcVar7;
  allocator local_e1;
  string local_e0;
  Window local_c0;
  Atom local_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  Atom local_a0;
  undefined8 local_90;
  
  grabFocus(this);
  bVar2 = anon_unknown.dwarf_4cfb48::WindowsImplX11Impl::ewmhSupported();
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_e0,"_NET_WM_BYPASS_COMPOSITOR",&local_e1);
    AVar4 = getAtom(&local_e0,false);
    std::__cxx11::string::~string((string *)&local_e0);
    if (AVar4 != 0) {
      XChangeProperty(this->m_display,this->m_window,AVar4,6,0x20,0,
                      &switchToFullscreen::bypassCompositor,1);
    }
    std::__cxx11::string::string((string *)&local_e0,"_NET_WM_STATE",&local_e1);
    AVar4 = getAtom(&local_e0,true);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::string((string *)&local_e0,"_NET_WM_STATE_FULLSCREEN",&local_e1);
    AVar5 = getAtom(&local_e0,true);
    std::__cxx11::string::~string((string *)&local_e0);
    if (AVar4 == 0 || AVar5 == 0) {
      poVar6 = err();
      pcVar7 = "Setting fullscreen failed. Could not get required atoms";
    }
    else {
      memset(&local_e0,0,0xc0);
      local_e0._M_dataplus._M_p._0_4_ = 0x21;
      local_c0 = this->m_window;
      local_b0 = 0x20;
      local_a8 = 1;
      local_90 = 1;
      pDVar1 = this->m_display;
      local_b8 = AVar4;
      local_a0 = AVar5;
      iVar3 = XSendEvent(pDVar1,*(undefined8 *)
                                 (*(long *)(pDVar1 + 0xe8) + 0x10 +
                                 (long)*(int *)(pDVar1 + 0xe0) * 0x80),0,0x180000,&local_e0);
      if (iVar3 != 0) {
        return;
      }
      poVar6 = err();
      pcVar7 = "Setting fullscreen failed, could not send \"_NET_WM_STATE\" event";
    }
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  return;
}

Assistant:

void WindowImplX11::switchToFullscreen()
{
    using namespace WindowsImplX11Impl;

    grabFocus();

    if (ewmhSupported())
    {
        Atom netWmBypassCompositor = getAtom("_NET_WM_BYPASS_COMPOSITOR");

        if (netWmBypassCompositor)
        {
            static const unsigned long bypassCompositor = 1;

            XChangeProperty(m_display,
                            m_window,
                            netWmBypassCompositor,
                            XA_CARDINAL,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&bypassCompositor),
                            1);
        }

        Atom netWmState = getAtom("_NET_WM_STATE", true);
        Atom netWmStateFullscreen = getAtom("_NET_WM_STATE_FULLSCREEN", true);

        if (!netWmState || !netWmStateFullscreen)
        {
            err() << "Setting fullscreen failed. Could not get required atoms" << std::endl;
            return;
        }

        XEvent event;
        std::memset(&event, 0, sizeof(event));

        event.type = ClientMessage;
        event.xclient.window = m_window;
        event.xclient.format = 32;
        event.xclient.message_type = netWmState;
        event.xclient.data.l[0] = 1; // _NET_WM_STATE_ADD
        event.xclient.data.l[1] = static_cast<long>(netWmStateFullscreen);
        event.xclient.data.l[2] = 0; // No second property
        event.xclient.data.l[3] = 1; // Normal window

        int result = XSendEvent(m_display,
                                DefaultRootWindow(m_display),
                                False,
                                SubstructureNotifyMask | SubstructureRedirectMask,
                                &event);

        if (!result)
            err() << "Setting fullscreen failed, could not send \"_NET_WM_STATE\" event" << std::endl;
    }
}